

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstate.cpp
# Opt level: O2

SQInteger __thiscall SQSharedState::CollectGarbage(SQSharedState *this,SQVM *vm)

{
  SQUnsignedInteger *pSVar1;
  SQCollectable_conflict *pSVar2;
  SQCollectable *this_00;
  SQCollectable_conflict *pSVar3;
  SQCollectable **tchain_00;
  SQInteger SVar4;
  SQCollectable_conflict *tchain;
  SQCollectable *local_30;
  
  tchain_00 = &local_30;
  local_30 = (SQCollectable *)0x0;
  RunMark(this,vm,(SQCollectable_conflict **)tchain_00);
  pSVar3 = this->_gc_chain;
  if (pSVar3 == (SQCollectable_conflict *)0x0) {
    SVar4 = 0;
  }
  else {
    pSVar1 = &(pSVar3->super_SQRefCounted)._uiRef;
    *pSVar1 = *pSVar1 + 1;
    SVar4 = 0;
    while (pSVar3 != (SQCollectable_conflict *)0x0) {
      (*(pSVar3->super_SQRefCounted)._vptr_SQRefCounted[5])(pSVar3);
      pSVar2 = pSVar3->_next;
      if (pSVar2 != (SQCollectable_conflict *)0x0) {
        pSVar1 = &(pSVar2->super_SQRefCounted)._uiRef;
        *pSVar1 = *pSVar1 + 1;
      }
      pSVar1 = &(pSVar3->super_SQRefCounted)._uiRef;
      *pSVar1 = *pSVar1 - 1;
      if (*pSVar1 == 0) {
        (*(pSVar3->super_SQRefCounted)._vptr_SQRefCounted[2])(pSVar3);
      }
      SVar4 = SVar4 + 1;
      pSVar3 = pSVar2;
    }
  }
  while (this_00 = *tchain_00, this_00 != (SQCollectable *)0x0) {
    SQCollectable::UnMark(this_00);
    tchain_00 = &this_00->_next;
  }
  this->_gc_chain = (SQCollectable_conflict *)local_30;
  return SVar4;
}

Assistant:

SQInteger SQSharedState::CollectGarbage(SQVM *vm)
{
    SQInteger n = 0;
    SQCollectable *tchain = NULL;

    RunMark(vm,&tchain);

    SQCollectable *t = _gc_chain;
    SQCollectable *nx = NULL;
    if(t) {
        t->_uiRef++;
        while(t) {
            t->Finalize();
            nx = t->_next;
            if(nx) nx->_uiRef++;
            if(--t->_uiRef == 0)
                t->Release();
            t = nx;
            n++;
        }
    }

    t = tchain;
    while(t) {
        t->UnMark();
        t = t->_next;
    }
    _gc_chain = tchain;

    return n;
}